

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O2

void __thiscall amrex::FabArrayBase::CPC::~CPC(CPC *this)

{
  BoxArray::~BoxArray(&this->m_dstba);
  BoxArray::~BoxArray(&this->m_srcba);
  CommMetaData::~CommMetaData(&this->super_CommMetaData);
  return;
}

Assistant:

FabArrayBase::CPC::~CPC ()
{}